

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

qint64 __thiscall QFSFileEnginePrivate::readFdFh(QFSFileEnginePrivate *this,char *data,qint64 len)

{
  long lVar1;
  FILE *__stream;
  int iVar2;
  QFSFileEngine *pQVar3;
  size_t sVar4;
  __off64_t __off;
  int *piVar5;
  qint64 qVar6;
  long in_RDX;
  long in_RSI;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  UnsignedIOType chunkSize;
  quint64 wantedBytes;
  SignedIOType result_1;
  size_t result;
  bool eof;
  qint64 readBytes;
  QFSFileEngine *q;
  QString *in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff48;
  FileError error;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  long local_68;
  qint64 local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  error = (FileError)((ulong)pQVar3 >> 0x20);
  if (in_RDX < 0) {
    QSystemError::stdString((int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    QAbstractFileEngine::setError
              ((QAbstractFileEngine *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT16(in_stack_ffffffffffffff56,
                                 CONCAT15(in_stack_ffffffffffffff55,
                                          CONCAT14(in_stack_ffffffffffffff54,
                                                   in_stack_ffffffffffffff50)))),
               (FileError)((ulong)in_stack_ffffffffffffff48 >> 0x20),in_stack_ffffffffffffff40);
    QString::~QString((QString *)0x19e0d9);
    local_40 = -1;
  }
  else {
    local_68 = 0;
    bVar7 = false;
    if (in_RDI->fh == (FILE *)0x0) {
      if (in_RDI->fd != -1) {
        do {
          std::numeric_limits<long>::max();
          qVar6 = qt_safe_read(CONCAT13(in_stack_ffffffffffffff57,
                                        CONCAT12(in_stack_ffffffffffffff56,
                                                 CONCAT11(in_stack_ffffffffffffff55,
                                                          in_stack_ffffffffffffff54))),
                               in_stack_ffffffffffffff48,(qint64)in_stack_ffffffffffffff40);
          in_stack_ffffffffffffff55 = false;
          if (0 < qVar6) {
            local_68 = qVar6 + local_68;
            in_stack_ffffffffffffff55 = local_68 < in_RDX;
          }
        } while ((bool)in_stack_ffffffffffffff55 != false);
        bVar7 = qVar6 == 0;
        in_stack_ffffffffffffff55 = 0;
      }
    }
    else {
      do {
        sVar4 = fread((void *)(in_RSI + local_68),1,in_RDX - local_68,(FILE *)in_RDI->fh);
        iVar2 = feof((FILE *)in_RDI->fh);
        bVar7 = iVar2 != 0;
        if ((bVar7) && (sVar4 == 0)) {
          __stream = (FILE *)in_RDI->fh;
          __off = ftello64((FILE *)in_RDI->fh);
          fseeko64(__stream,__off,0);
          break;
        }
        local_68 = sVar4 + local_68;
        in_stack_ffffffffffffff57 = false;
        if (!bVar7) {
          if (sVar4 == 0) {
            piVar5 = __errno_location();
            in_stack_ffffffffffffff56 = *piVar5 == 4;
            in_stack_ffffffffffffff57 = in_stack_ffffffffffffff56;
          }
          else {
            in_stack_ffffffffffffff56 = local_68 < in_RDX;
            in_stack_ffffffffffffff57 = in_stack_ffffffffffffff56;
          }
        }
      } while ((bool)in_stack_ffffffffffffff57 != false);
    }
    if ((!bVar7) && (local_68 == 0)) {
      local_68 = -1;
      __errno_location();
      QSystemError::stdString(error);
      QAbstractFileEngine::setError
                ((QAbstractFileEngine *)
                 CONCAT17(in_stack_ffffffffffffff57,
                          CONCAT16(in_stack_ffffffffffffff56,
                                   CONCAT15(in_stack_ffffffffffffff55,
                                            CONCAT14(in_stack_ffffffffffffff54,
                                                     in_stack_ffffffffffffff50)))),error,
                 in_stack_ffffffffffffff40);
      QString::~QString((QString *)0x19e319);
    }
    local_40 = local_68;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

qint64 QFSFileEnginePrivate::readFdFh(char *data, qint64 len)
{
    Q_Q(QFSFileEngine);

    if (len < 0 || len != qint64(size_t(len))) {
        q->setError(QFile::ReadError, QSystemError::stdString(EINVAL));
        return -1;
    }

    qint64 readBytes = 0;
    bool eof = false;

    if (fh) {
        // Buffered stdlib mode.

        size_t result;
        do {
            result = fread(data + readBytes, 1, size_t(len - readBytes), fh);
            eof = feof(fh); // Doesn't change errno
            if (eof && result == 0) {
                // On OS X, this is needed, e.g., if a file was written to
                // through another stream since our last read. See test
                // tst_QFile::appendAndRead
                QT_FSEEK(fh, QT_FTELL(fh), SEEK_SET); // re-sync stream.
                break;
            }
            readBytes += result;
        } while (!eof && (result == 0 ? errno == EINTR : readBytes < len));

    } else if (fd != -1) {
        // Unbuffered stdio mode.

        SignedIOType result;
        do {
            // calculate the chunk size
            // on Windows or 32-bit no-largefile Unix, we'll need to read in chunks
            // we limit to the size of the signed type, otherwise we could get a negative number as a result
            quint64 wantedBytes = quint64(len) - quint64(readBytes);
            UnsignedIOType chunkSize = std::numeric_limits<SignedIOType>::max();
            if (chunkSize > wantedBytes)
                chunkSize = wantedBytes;
            result = QT_READ(fd, data + readBytes, chunkSize);
        } while (result > 0 && (readBytes += result) < len);

        // QT_READ (::read()) returns 0 to indicate end-of-file
        eof = result == 0;
    }

    if (!eof && readBytes == 0) {
        readBytes = -1;
        q->setError(QFile::ReadError, QSystemError::stdString(errno));
    }

    return readBytes;
}